

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O2

QRgbaFloat32 *
fetchRGBToRGB32F<(QImage::Format)9>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  QRgbaFloat<float> QVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)count;
  if (count < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    uVar1 = fetchPixel<(QPixelLayout::BPP)5>(src,index);
    uVar1 = convertPixelToRGB32<(QImage::Format)9>(uVar1);
    QVar4 = QRgbaFloat<float>::fromArgb32(uVar1);
    *(QRgbaFloat<float> *)((long)&buffer->r + uVar3) = QVar4;
    index = index + 1;
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchRGBToRGB32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                    const QList<QRgb> *, QDitherInfo *)
{
    for (int i = 0; i < count; ++i)
        buffer[i] = convertPixelToRGB32F<Format>(fetchPixel<bitsPerPixel<Format>()>(src, index + i));
    return buffer;
}